

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::MatchExpr<float,_Catch::Matchers::Floating::WithinRelMatcher>::streamReconstructedExpression
          (MatchExpr<float,_Catch::Matchers::Floating::WithinRelMatcher> *this,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  StringMaker<float,void> *this_00;
  string matcherAsString;
  char local_59;
  string local_58;
  string local_38;
  
  this_00 = (StringMaker<float,void> *)&this->m_matcher;
  Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_(&local_58,(MatcherUntypedBase *)this_00);
  StringMaker<float,void>::convert_abi_cxx11_(&local_38,this_00,*this->m_arg);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)os,local_38._M_dataplus._M_p,local_38._M_string_length);
  local_59 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (local_58._M_string_length == DAT_00267660) {
    if (local_58._M_string_length != 0) {
      iVar1 = bcmp(local_58._M_dataplus._M_p,Detail::unprintableString_abi_cxx11_,
                   local_58._M_string_length);
      if (iVar1 != 0) goto LAB_001860e4;
    }
    operator<<((ostream *)os,&this->m_matcherString);
  }
  else {
LAB_001860e4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,local_58._M_dataplus._M_p,local_58._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            auto matcherAsString = m_matcher.toString();
            os << Catch::Detail::stringify( m_arg ) << ' ';
            if( matcherAsString == Detail::unprintableString )
                os << m_matcherString;
            else
                os << matcherAsString;
        }